

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_c91b1::NumberDominanceGraphNodesDfs
               (VmBlock *block,uint *preOrder,uint *postOrder)

{
  uint uVar1;
  VmBlock **ppVVar2;
  VmBlock *child;
  uint i;
  uint *postOrder_local;
  uint *preOrder_local;
  VmBlock *block_local;
  
  uVar1 = *preOrder;
  *preOrder = uVar1 + 1;
  block->dominanceGraphPreOrderId = uVar1;
  block->visited = true;
  child._4_4_ = 0;
  while( true ) {
    uVar1 = SmallArray<VmBlock_*,_4U>::size(&block->dominanceChildren);
    if (uVar1 <= child._4_4_) break;
    ppVVar2 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceChildren,child._4_4_);
    if (((*ppVVar2)->visited & 1U) == 0) {
      NumberDominanceGraphNodesDfs(*ppVVar2,preOrder,postOrder);
    }
    child._4_4_ = child._4_4_ + 1;
  }
  uVar1 = *postOrder;
  *postOrder = uVar1 + 1;
  block->dominanceGraphPostOrderId = uVar1;
  return;
}

Assistant:

void NumberDominanceGraphNodesDfs(VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->dominanceGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		{
			VmBlock *child = block->dominanceChildren[i];

			if(!child->visited)
				NumberDominanceGraphNodesDfs(child, preOrder, postOrder);
		}

		block->dominanceGraphPostOrderId = postOrder++;
	}